

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
bioparser::Parser<biosoup::Sequence>::Store(Parser<biosoup::Sequence> *this,size_t count,bool strip)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  invalid_argument *this_00;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  if ((ulong)((long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) < this->buffer_ptr_ + count) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[bioparser::Parser::Store] error: buffer overflow");
  }
  else {
    uVar4 = this->storage_ptr_ + count;
    if (uVar4 >> 0x20 == 0) {
      uVar6 = (long)(this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar6 < uVar4) {
        std::vector<char,_std::allocator<char>_>::resize(&this->storage_,uVar6 * 2);
      }
      memcpy((this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->storage_ptr_,
             (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->buffer_ptr_,count);
      iVar7 = (int)count;
      iVar5 = iVar7;
      if (strip) {
        uVar1 = this->storage_ptr_;
        pcVar2 = (this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = iVar7 + 1;
        uVar4 = count & 0xffffffff;
        do {
          if (uVar4 == 0) {
            iVar5 = 0;
            break;
          }
          iVar3 = isspace((int)pcVar2[uVar4 + ((ulong)uVar1 - 1)]);
          iVar5 = iVar5 + -1;
          uVar4 = uVar4 - 1;
        } while (iVar3 != 0);
      }
      this->storage_ptr_ = this->storage_ptr_ + iVar5;
      this->buffer_ptr_ = this->buffer_ptr_ + iVar7 + 1;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[bioparser::Parser::Store] error: storage overflow");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Store(std::size_t count, bool strip = false) {
    if (buffer_ptr_ + count > buffer_.size()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: buffer overflow");
    }
    if (storage_ptr_ + count > std::numeric_limits<std::uint32_t>::max()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: storage overflow");
    }
    if (storage_ptr_ + count > storage_.size()) {
      storage_.resize(2 * storage_.size());
    }
    std::memcpy(&storage_[storage_ptr_], &buffer_[buffer_ptr_], count);
    storage_ptr_ += strip ? RightStrip(&storage_[storage_ptr_], count) : count;
    buffer_ptr_ += count + 1;  // ignore sought character
  }